

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionValue *
GetFunctionForType(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ExprBase *value,TypeFunction *type)

{
  Allocator *pAVar1;
  TypeFunction *pTVar2;
  TypeHandle *pTVar3;
  TypeHandle *pTVar4;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  FunctionValue *pFVar9;
  TypeBase *pTVar10;
  TypeBase *pTVar11;
  undefined4 extraout_var;
  uint index;
  IntrusiveList<TypeHandle> *pIVar12;
  FunctionData *pFVar13;
  IntrusiveList<TypeHandle> *this;
  IntrusiveList<TypeHandle> *pIVar14;
  ExpressionContext *this_00;
  TypeFunction *local_a00;
  TypeFunction *local_9f0;
  FunctionValue bestGenericMatch;
  IntrusiveList<TypeHandle> arguments;
  SynIdentifier *local_9a8;
  FunctionValue bestMatch;
  undefined4 uStack_964;
  SmallArray<FunctionValue,_32U> functions;
  IntrusiveList<MatchData> aliases;
  TypeHandle *node;
  
  pAVar1 = ctx->allocator;
  memset(functions.little,0,0x300);
  functions.count = 0;
  functions.max = 0x20;
  functions.data = functions.little;
  functions.allocator = pAVar1;
  GetNodeFunctions(ctx,source,value,&functions);
  if (functions.count != 0) {
    bestMatch.source = (SynBase *)0x0;
    bestMatch.function = (FunctionData *)0x0;
    bestMatch.context = (ExprBase *)0x0;
    bestGenericMatch.source = (SynBase *)0x0;
    bestGenericMatch.function = (FunctionData *)0x0;
    bestGenericMatch.context = (ExprBase *)0x0;
    pIVar14 = &type->arguments;
    local_9f0 = (TypeFunction *)0x0;
    local_a00 = (TypeFunction *)0x0;
    for (index = 0; index < functions.count; index = index + 1) {
      pFVar9 = SmallArray<FunctionValue,_32U>::operator[](&functions,index);
      pTVar2 = pFVar9->function->type;
      uVar6 = IntrusiveList<TypeHandle>::size(pIVar14);
      this = &pTVar2->arguments;
      uVar7 = IntrusiveList<TypeHandle>::size(this);
      if (uVar6 == uVar7) {
        if ((type->super_TypeBase).isGeneric == true) {
          aliases.head = (MatchData *)0x0;
          aliases.tail = (MatchData *)0x0;
          pTVar10 = MatchGenericType(ctx,source,type->returnType,pTVar2->returnType,&aliases,true);
          arguments.head = (TypeHandle *)0x0;
          arguments.tail._0_1_ = 0;
          arguments.tail._1_7_ = 0;
          pIVar12 = pIVar14;
          while ((pTVar3 = pIVar12->head, pTVar3 != (TypeHandle *)0x0 &&
                 (pTVar4 = this->head, pTVar4 != (TypeHandle *)0x0))) {
            pTVar11 = MatchGenericType(ctx,source,pTVar3->type,pTVar4->type,&aliases,true);
            if ((pTVar11 != (TypeBase *)0x0) && (pTVar11->isGeneric == false)) {
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
              node = (TypeHandle *)CONCAT44(extraout_var,iVar8);
              node->type = pTVar11;
              node->next = (TypeHandle *)0x0;
              node->listed = false;
              IntrusiveList<TypeHandle>::push_back(&arguments,node);
            }
            pIVar12 = (IntrusiveList<TypeHandle> *)&pTVar3->next;
            this = (IntrusiveList<TypeHandle> *)&pTVar4->next;
          }
          if (pTVar10 != (TypeBase *)0x0) {
            uVar6 = IntrusiveList<TypeHandle>::size(&arguments);
            uVar7 = IntrusiveList<TypeHandle>::size(pIVar14);
            if (uVar6 == uVar7) {
              if (bestGenericMatch.function != (FunctionData *)0x0) goto LAB_00144b19;
              pFVar9 = SmallArray<FunctionValue,_32U>::operator[](&functions,index);
              bestGenericMatch.source = pFVar9->source;
              bestGenericMatch.function = pFVar9->function;
              bestGenericMatch.context = pFVar9->context;
              arguments_01.tail._0_1_ = arguments.tail._0_1_;
              arguments_01.head = arguments.head;
              arguments_01.tail._1_7_ = arguments.tail._1_7_;
              local_9f0 = ExpressionContext::GetFunctionType(ctx,source,pTVar10,arguments_01);
            }
          }
        }
        else if ((pTVar2->super_TypeBase).isGeneric == true) {
          aliases.head = (MatchData *)0x0;
          aliases.tail = (MatchData *)0x0;
          iVar8 = 0;
          pIVar12 = pIVar14;
          while ((pTVar3 = this->head, pTVar3 != (TypeHandle *)0x0 &&
                 (pTVar4 = pIVar12->head, pTVar4 != (TypeHandle *)0x0))) {
            pTVar10 = MatchGenericType(ctx,source,pTVar3->type,pTVar4->type,&aliases,true);
            if (pTVar10 != (TypeBase *)0x0) {
              iVar8 = iVar8 + (pTVar10->isGeneric ^ 1);
            }
            this = (IntrusiveList<TypeHandle> *)&pTVar3->next;
            pIVar12 = (IntrusiveList<TypeHandle> *)&pTVar4->next;
          }
          if ((pTVar2->returnType == ctx->typeAuto) || (pTVar2->returnType == type->returnType)) {
            iVar8 = iVar8 + 1;
          }
          uVar6 = IntrusiveList<TypeHandle>::size(pIVar14);
          if (iVar8 == uVar6 + 1) {
            if (bestGenericMatch.function != (FunctionData *)0x0) goto LAB_00144b19;
            pFVar9 = SmallArray<FunctionValue,_32U>::operator[](&functions,index);
            bestGenericMatch.source = pFVar9->source;
            bestGenericMatch.function = pFVar9->function;
            bestGenericMatch.context = pFVar9->context;
            local_9f0 = type;
          }
        }
        else if (pTVar2 == type) {
          if (bestMatch.function != (FunctionData *)0x0) goto LAB_00144b19;
          pFVar9 = SmallArray<FunctionValue,_32U>::operator[](&functions,index);
          bestMatch.source = pFVar9->source;
          bestMatch.function = pFVar9->function;
          bestMatch.context = pFVar9->context;
          local_a00 = type;
        }
      }
    }
    pFVar9 = &bestGenericMatch;
    if (bestMatch.function != (FunctionData *)0x0) {
      pFVar9 = &bestMatch;
    }
    pFVar13 = pFVar9->function;
    __return_storage_ptr__->source = pFVar9->source;
    __return_storage_ptr__->function = pFVar13;
    __return_storage_ptr__->context = pFVar9->context;
    if (bestMatch.function == (FunctionData *)0x0) {
      local_a00 = local_9f0;
    }
    pFVar13 = __return_storage_ptr__->function;
    if (pFVar13 != (FunctionData *)0x0) {
      this_00 = (ExpressionContext *)&aliases;
      SmallArray<ArgumentData,_32U>::SmallArray
                ((SmallArray<ArgumentData,_32U> *)this_00,ctx->allocator);
      pIVar14 = &local_a00->arguments;
      while (pTVar3 = pIVar14->head, pTVar3 != (TypeHandle *)0x0) {
        arguments.tail._0_1_ = 0;
        local_9a8 = (SynIdentifier *)0x0;
        this_00 = (ExpressionContext *)&aliases;
        arguments.head = (TypeHandle *)source;
        SmallArray<ArgumentData,_32U>::push_back
                  ((SmallArray<ArgumentData,_32U> *)&aliases,(ArgumentData *)&arguments);
        pIVar14 = (IntrusiveList<TypeHandle> *)&pTVar3->next;
      }
      bVar5 = ExpressionContext::IsGenericFunction(this_00,pFVar13);
      if (bVar5) {
        arguments_00._12_4_ = uStack_964;
        arguments_00.count = aliases.tail._0_4_;
        arguments_00.data = (ArgumentData *)aliases.head;
        CreateGenericFunctionInstance
                  ((FunctionValue *)&arguments,ctx,source,*__return_storage_ptr__,
                   (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,false);
        __return_storage_ptr__->context = (ExprBase *)local_9a8;
        __return_storage_ptr__->source = (SynBase *)arguments.head;
        __return_storage_ptr__->function =
             (FunctionData *)CONCAT71(arguments.tail._1_7_,arguments.tail._0_1_);
        pFVar13 = __return_storage_ptr__->function;
      }
      if (pFVar13 != (FunctionData *)0x0) {
        if (local_a00->returnType == ctx->typeAuto) {
          local_a00 = ExpressionContext::GetFunctionType
                                (ctx,source,pFVar13->type->returnType,local_a00->arguments);
        }
        if (pFVar13->type == local_a00) {
          SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&aliases);
          goto LAB_00144b26;
        }
      }
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&aliases);
    }
  }
LAB_00144b19:
  __return_storage_ptr__->source = (SynBase *)0x0;
  __return_storage_ptr__->function = (FunctionData *)0x0;
  __return_storage_ptr__->context = (ExprBase *)0x0;
LAB_00144b26:
  SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue GetFunctionForType(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeFunction *type)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	if(!functions.empty())
	{
		FunctionValue bestMatch;
		TypeFunction *bestMatchTarget = NULL;

		FunctionValue bestGenericMatch;
		TypeFunction *bestGenericMatchTarget = NULL;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			TypeFunction *functionType = functions[i].function->type;

			if(type->arguments.size() != functionType->arguments.size())
				continue;

			if(type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				TypeBase *returnType = MatchGenericType(ctx, source, type->returnType, functionType->returnType, aliases, true);
				IntrusiveList<TypeHandle> arguments;

				for(TypeHandle *lhs = type->arguments.head, *rhs = functionType->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(match));
				}

				if(returnType && arguments.size() == type->arguments.size())
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = ctx.GetFunctionType(source, returnType, arguments);
				}
			}
			else if(functionType->isGeneric)
			{
				unsigned matches = 0;

				IntrusiveList<MatchData> aliases;

				for(TypeHandle *lhs = functionType->arguments.head, *rhs = type->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						matches++;
				}

				if(functionType->returnType == ctx.typeAuto || functionType->returnType == type->returnType)
					matches++;

				if(matches == type->arguments.size() + 1)
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = type;
				}
			}
			else if(functionType == type)
			{
				if(bestMatch)
					return FunctionValue();

				bestMatch = functions[i];
				bestMatchTarget = type;
			}
		}

		FunctionValue bestOverload = bestMatch ? bestMatch : bestGenericMatch;
		TypeFunction *bestTarget = bestMatch ? bestMatchTarget : bestGenericMatchTarget;

		if(bestOverload)
		{
			SmallArray<ArgumentData, 32> arguments(ctx.allocator);

			for(TypeHandle *curr = bestTarget->arguments.head; curr; curr = curr->next)
				arguments.push_back(ArgumentData(source, false, NULL, curr->type, NULL));

			FunctionData *function = bestOverload.function;

			if(ctx.IsGenericFunction(function))
				bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, IntrusiveList<TypeHandle>(), arguments, false);

			if(bestOverload)
			{
				if(bestTarget->returnType == ctx.typeAuto)
					bestTarget = ctx.GetFunctionType(source, bestOverload.function->type->returnType, bestTarget->arguments);

				if(bestOverload.function->type == bestTarget)
					return bestOverload;
			}
		}
	}

	return FunctionValue();
}